

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O0

void __thiscall tst_qpromise_then::rejectSync(tst_qpromise_then *this)

{
  bool bVar1;
  bool local_c8;
  bool local_c7;
  bool local_c6;
  bool local_c5 [5];
  QString local_c0;
  undefined1 *local_a8;
  QString *local_a0;
  QPromiseBase<int> local_98;
  QPromiseBase<void> local_88;
  QPromiseBase<void> local_78;
  undefined1 local_68 [8];
  QString error;
  undefined1 local_38 [8];
  Promise output;
  undefined1 local_20 [8];
  QPromise<int> input;
  tst_qpromise_then *this_local;
  
  output.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QtPromise::QPromise<int>::resolve
            ((QPromise<int> *)local_20,(int *)((long)&output.super_QPromiseBase<int>.m_d.d + 4));
  QtPromise::QPromiseBase<int>::then<tst_qpromise_then::rejectSync()::__0>
            ((QPromiseBase<int> *)local_38,(anon_class_1_0_00000001 *)local_20);
  QString::QString((QString *)local_68);
  local_a0 = (QString *)local_68;
  QtPromise::QPromiseBase<int>::then<tst_qpromise_then::rejectSync()::__1>
            (&local_98,(anon_class_8_1_a7dec128 *)local_38);
  local_a8 = local_68;
  QtPromise::QPromiseBase<void>::fail<tst_qpromise_then::rejectSync()::__2>
            (&local_88,(anon_class_8_1_a7dec128 *)&local_98);
  QtPromise::QPromiseBase<void>::wait(&local_78,&local_88);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_78);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_88);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_98);
  QString::QString(&local_c0,"foo42");
  bVar1 = QTest::qCompare((QString *)local_68,&local_c0,"error","QString{\"foo42\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0x83);
  QString::~QString(&local_c0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_c5[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
    local_c6 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_c5,&local_c6,"input.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0x84);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_c7 = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_38);
      local_c8 = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_c7,&local_c8,"output.isRejected()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                         ,0x85);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_c5[1] = false;
        local_c5[2] = false;
        local_c5[3] = false;
        local_c5[4] = false;
      }
      else {
        local_c5[1] = true;
        local_c5[2] = false;
        local_c5[3] = false;
        local_c5[4] = false;
      }
    }
    else {
      local_c5[1] = true;
      local_c5[2] = false;
      local_c5[3] = false;
      local_c5[4] = false;
    }
  }
  else {
    local_c5[1] = true;
    local_c5[2] = false;
    local_c5[3] = false;
    local_c5[4] = false;
  }
  QString::~QString((QString *)local_68);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_qpromise_then::rejectSync()
{
    auto input = QtPromise::QPromise<int>::resolve(42);
    auto output = input.then([](int res) {
        throw QString{"foo%1"}.arg(res);
        return 42;
    });

    QString error;
    output
        .then([&](int res) {
            error += "bar" + QString::number(res);
        })
        .fail([&](const QString& err) {
            error += err;
        })
        .wait();

    QCOMPARE(error, QString{"foo42"});
    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isRejected(), true);
}